

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseErrorTest_MethodOptionTypeError_Test::
~ParseErrorTest_MethodOptionTypeError_Test(ParseErrorTest_MethodOptionTypeError_Test *this)

{
  ParseErrorTest_MethodOptionTypeError_Test *this_local;
  
  ~ParseErrorTest_MethodOptionTypeError_Test(this);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseErrorTest, MethodOptionTypeError) {
  // This used to cause an infinite loop.
  ExpectHasErrors(
      "message Baz {}\n"
      "service Foo {\n"
      "  rpc Bar(Baz) returns(Baz) { option invalid syntax; }\n"
      "}\n",
      "2:45: Expected \"=\".\n");
}